

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O0

void nrg::PrioExecution::push<void(*)()>(Queue *queue,_func_void *fn)

{
  QueueElement local_68;
  undefined1 local_40 [8];
  QueueElement elem;
  _func_void *fn_local;
  Queue *queue_local;
  
  local_40._0_4_ = 0;
  elem.what._M_invoker = (_Invoker_type)fn;
  local_40._4_4_ = next();
  std::function<void()>::function<void(*)(),void>
            ((function<void()> *)&elem,(_func_void **)&elem.what._M_invoker);
  QueueElement::QueueElement(&local_68,(QueueElement *)local_40);
  push(queue,&local_68);
  QueueElement::~QueueElement(&local_68);
  QueueElement::~QueueElement((QueueElement *)local_40);
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { 0, next(), std::move(fn) };
        push(queue, std::move(elem));
    }